

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void LLGrammatical(vector<quadraple,_std::allocator<quadraple>_> *token)

{
  LLGrammaticalAnalyzer analyzer;
  LLGrammaticalAnalyzer LStack_168;
  
  LLGrammaticalAnalyzer::LLGrammaticalAnalyzer(&LStack_168);
  LLGrammaticalAnalyzer::CalcFIRST(&LStack_168);
  LLGrammaticalAnalyzer::PrintFIRST(&LStack_168);
  LLGrammaticalAnalyzer::CalcFOLLOW(&LStack_168);
  LLGrammaticalAnalyzer::PrintFOLLOW(&LStack_168);
  LLGrammaticalAnalyzer::CreateTABLE(&LStack_168);
  LLGrammaticalAnalyzer::AnalyzeToken(&LStack_168,token);
  LLGrammaticalAnalyzer::~LLGrammaticalAnalyzer(&LStack_168);
  return;
}

Assistant:

void LLGrammatical(vector <quadraple> &token){
    LLGrammaticalAnalyzer analyzer;
    //analyzer.PrintProductionRules();
    analyzer.CalcFIRST();
    analyzer.PrintFIRST();
    analyzer.CalcFOLLOW();
    analyzer.PrintFOLLOW();
    analyzer.CreateTABLE();
    analyzer.AnalyzeToken(token);
}